

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O3

void deqp::gles3::Functional::eval_selection_vec3(ShaderEvalContext *c)

{
  long lVar1;
  float *pfVar2;
  float afStack_48 [2];
  undefined8 local_40;
  float local_38;
  int aiStack_30 [6];
  undefined8 local_18;
  float local_10;
  float local_c;
  undefined8 uStack_8;
  
  local_18 = *(undefined8 *)(c->in[1].m_data + 1);
  local_10 = c->in[1].m_data[0];
  local_c = c->in[2].m_data[3];
  uStack_8 = *(undefined8 *)(c->in[2].m_data + 1);
  pfVar2 = &local_c;
  if (0.0 < c->in[0].m_data[2]) {
    pfVar2 = (float *)&local_18;
  }
  local_40 = *(undefined8 *)pfVar2;
  local_38 = pfVar2[2];
  aiStack_30[2] = 0;
  aiStack_30[3] = 1;
  aiStack_30[4] = 2;
  lVar1 = 2;
  do {
    (c->color).m_data[aiStack_30[lVar1]] = afStack_48[lVar1];
    lVar1 = lVar1 + 1;
  } while (lVar1 != 5);
  return;
}

Assistant:

void eval_selection_vec3	(ShaderEvalContext& c) { c.color.xyz()	= selection(c.in[0].z() > 0.0f,		c.in[1].swizzle(1, 2, 0),		c.in[2].swizzle(3, 1, 2)); }